

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lfunc.c
# Opt level: O0

UpVal * luaF_findupval(lua_State *L,StkId level)

{
  UpVal *pUVar1;
  bool bVar2;
  UpVal *p;
  UpVal **pp;
  StkId level_local;
  lua_State *L_local;
  
  p = (UpVal *)&L->openupval;
  while( true ) {
    pUVar1 = (UpVal *)p->next;
    bVar2 = false;
    if (pUVar1 != (UpVal *)0x0) {
      bVar2 = level <= (StkId)(pUVar1->v).p;
    }
    if (!bVar2) break;
    if ((StkId)(pUVar1->v).p == level) {
      return pUVar1;
    }
    p = (UpVal *)&pUVar1->u;
  }
  pUVar1 = newupval(L,level,(UpVal **)p);
  return pUVar1;
}

Assistant:

UpVal *luaF_findupval (lua_State *L, StkId level) {
  UpVal **pp = &L->openupval;
  UpVal *p;
  lua_assert(isintwups(L) || L->openupval == NULL);
  while ((p = *pp) != NULL && uplevel(p) >= level) {  /* search for it */
    lua_assert(!isdead(G(L), p));
    if (uplevel(p) == level)  /* corresponding upvalue? */
      return p;  /* return it */
    pp = &p->u.open.next;
  }
  /* not found: create a new upvalue after 'pp' */
  return newupval(L, level, pp);
}